

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O1

void __thiscall
so_5::impl::state_switch_guard_t::state_switch_guard_t(state_switch_guard_t *this,agent_t *agent)

{
  agent_status_t aVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  this->m_agent = agent;
  aVar1 = agent->m_current_status;
  this->m_previous_status = aVar1;
  if (aVar1 == state_switch_in_progress) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,
               "an attempt to switch agent state when another state switch operation is in progress for the same agent"
               ,"");
    exception_t::raise(0x24ada2);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  agent->m_current_status = state_switch_in_progress;
  return;
}

Assistant:

state_switch_guard_t(
		agent_t & agent )
		:	m_agent( agent )
		,	m_previous_status( agent.m_current_status )
	{
		if( agent_t::agent_status_t::state_switch_in_progress
				== agent.m_current_status ) 
			SO_5_THROW_EXCEPTION(
					rc_another_state_switch_in_progress,
					"an attempt to switch agent state when another state "
					"switch operation is in progress for the same agent" );

		agent.m_current_status = agent_t::agent_status_t::state_switch_in_progress;
	}